

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O3

void __thiscall calculator::Word::Word(Word *this,string *word,bool minus,Tag tag)

{
  pointer pcVar1;
  
  Token::Token(&this->super_Token,tag);
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Word_001184e0;
  (this->__lexeme)._M_dataplus._M_p = (pointer)&(this->__lexeme).field_2;
  pcVar1 = (word->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->__lexeme,pcVar1,pcVar1 + word->_M_string_length);
  this->__minus = minus;
  return;
}

Assistant:

Word(const std::string& word, bool minus = false, Tag tag = Tag::Identifier)
        : Token(tag), __lexeme(word), __minus(minus) {}